

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O3

void __thiscall
Am_Priority_List::Change_Main_Priority(Am_Priority_List *this,Am_Object *obj,float main_priority)

{
  Am_Priority_List_Item *item;
  ostream *poVar1;
  Am_Object local_20;
  
  Am_Object::Am_Object(&local_20,obj);
  item = take_out_obj(this,&local_20);
  Am_Object::~Am_Object(&local_20);
  if (item != (Am_Priority_List_Item *)0x0) {
    item->main_priority = main_priority;
    insert_item_at_right_place(this,item);
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
  poVar1 = std::operator<<(poVar1,"Change_Main_Priority for ");
  poVar1 = ::operator<<(poVar1,obj);
  poVar1 = std::operator<<(poVar1," but not on list ");
  ::operator<<(poVar1,this);
  std::endl<char,std::char_traits<char>>(poVar1);
  Am_Error();
}

Assistant:

void
Am_Priority_List::Change_Main_Priority(Am_Object obj, float main_priority)
{
  Am_Priority_List_Item *item = this->take_out_obj(obj);
  if (!item) {
    Am_ERRORO("Change_Main_Priority for " << obj << " but not on list "
                                          << *this,
              obj, 0);
  }
  item->main_priority = main_priority;
  this->insert_item_at_right_place(item);
}